

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

void __thiscall module::module(module *this,string *basePath,string *module)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  long lVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_90;
  string local_70;
  string local_50;
  
  (this->base_path)._M_dataplus._M_p = (pointer)&(this->base_path).field_2;
  (this->base_path)._M_string_length = 0;
  (this->base_path).field_2._M_local_buf[0] = '\0';
  (this->sepd)._M_dataplus._M_p = (pointer)&(this->sepd).field_2;
  (this->sepd)._M_string_length = 0;
  (this->sepd).field_2._M_local_buf[0] = '\0';
  (this->module_header)._M_dataplus._M_p = (pointer)&(this->module_header).field_2;
  (this->module_header)._M_string_length = 0;
  (this->module_header).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->metaData)._M_t._M_impl.super__Rb_tree_header;
  (this->metaData)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->metaData)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->metaData)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->metaData)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->metaData)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::_M_assign((string *)this);
  lVar3 = std::__cxx11::string::find((char *)this,0x12750d,0);
  pcVar4 = "/";
  if (lVar3 != -1) {
    pcVar4 = "\\";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->sepd,0,(char *)(this->sepd)._M_string_length,(ulong)pcVar4);
  pcVar2 = (basePath->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + basePath->_M_string_length);
  pcVar2 = (module->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + module->_M_string_length);
  std::__cxx11::string::append((char *)&local_90);
  listFilesRecursively(this,&local_70,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((this->module_header)._M_string_length != 0) {
    utilities::normalizePath(&local_50,&this->module_header);
    getMetaData(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

module::module(std::string basePath, std::string module)
{
    base_path = basePath;
    sepd = (base_path.find("\\") != std::string::npos) ? "\\" : "/";

#if defined(DEBUG)
    std::cout << "looking for module: " << module << std::endl;
#endif
    listFilesRecursively(basePath, module + ".h");

    if(!module_header.empty())
    {
        getMetaData( utilities::normalizePath(module_header) );
#if defined(DEBUG)
        std::cout << module << " : metaData " << metaData.size() << std::endl;
        std::cout << "dependencies length: " << metaData["dependencies"].length() << std::endl;
#endif
    }
}